

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_string.cpp
# Opt level: O2

string * duckdb::StandardStringCast<unsigned_short>
                   (string *__return_storage_ptr__,unsigned_short input)

{
  LogicalType LStack_a8;
  anon_union_16_2_67f50693_for_value local_90;
  Vector v;
  
  LogicalType::LogicalType(&LStack_a8,VARCHAR);
  Vector::Vector(&v,&LStack_a8,0x800);
  LogicalType::~LogicalType(&LStack_a8);
  local_90.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)NumericHelper::FormatSigned<unsigned_short>(input,&v);
  string_t::GetString_abi_cxx11_(__return_storage_ptr__,(string_t *)&local_90.pointer);
  Vector::~Vector(&v);
  return __return_storage_ptr__;
}

Assistant:

string StandardStringCast(T input) {
	Vector v(LogicalType::VARCHAR);
	return StringCast::Operation(input, v).GetString();
}